

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

void push_grp_stack(grp_stack *mystack,grp_stack_data data)

{
  grp_stack_item *pgVar1;
  grp_stack_item *in_RSI;
  long *in_RDI;
  grp_stack_data in_stack_ffffffffffffffe8;
  
  if (in_RDI != (long *)0x0) {
    pgVar1 = grp_stack_append(in_RSI,in_stack_ffffffffffffffe8);
    in_RDI[1] = (long)pgVar1;
    *in_RDI = *in_RDI + 1;
  }
  return;
}

Assistant:

static void push_grp_stack(grp_stack* mystack, grp_stack_data data) {
  if(!mystack) return;
  mystack->top = grp_stack_append(mystack->top, data);
  ++mystack->stack_size;
  return;
}